

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

int png_check_fp_number(png_const_charp string,size_t size,int *statep,png_size_tp whereami)

{
  int iVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar5;
  char cVar6;
  byte bVar9;
  uint uVar7;
  char *pcVar8;
  byte bVar10;
  undefined2 uVar11;
  undefined4 *puVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  byte bVar4;
  
  bVar10 = (byte)((ulong)whereami >> 8);
  uVar7 = *statep;
  pcVar8 = (char *)(ulong)uVar7;
  uVar13 = *whereami;
  uVar14 = uVar13;
  if (uVar13 < size) {
    do {
      uVar14 = uVar13;
      switch(string[uVar13]) {
      case '+':
        uVar7 = 4;
        break;
      case ',':
      case '/':
      case ':':
      case ';':
      case '<':
      case '=':
      case '>':
      case '?':
      case '@':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
        goto switchD_0010bb9b_caseD_2c;
      case '-':
        uVar7 = 0x84;
        break;
      case '.':
        uVar7 = 0x10;
        break;
      case '0':
        uVar7 = 8;
        break;
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        uVar7 = 0x108;
        break;
      case 'E':
        goto switchD_0010bb9b_caseD_45;
      default:
        if (string[uVar13] != 'e') goto switchD_0010bb9b_caseD_2c;
switchD_0010bb9b_caseD_45:
        uVar7 = 0x20;
      }
      uVar15 = (uint)pcVar8 & 3;
      iVar1 = (uVar7 & 0x3c) + uVar15;
      uVar16 = iVar1 - 4;
      cVar6 = (char)pcVar8;
      if (uVar16 < 0xd) {
        iVar5 = *(int *)(&DAT_0012db5c + (ulong)uVar16 * 4);
        switch(iVar1) {
        case 4:
          *pcVar8 = *pcVar8 + cVar6;
          pcVar8 = (char *)((ulong)pcVar8 & 0xffffffffffffff04);
          *pcVar8 = *pcVar8 + (char)pcVar8;
          uVar7 = (int)pcVar8 + 0x15fffd29;
          pcVar8 = (char *)(ulong)uVar7;
          cVar6 = (char)uVar7;
          *pcVar8 = *pcVar8 + cVar6;
          *pcVar8 = *pcVar8 + cVar6;
          *pcVar8 = *pcVar8 + cVar6;
          *pcVar8 = *pcVar8 + (char)statep;
          *pcVar8 = *pcVar8 + cVar6;
          *pcVar8 = *pcVar8 + (char)((ulong)(&DAT_0012db5c + iVar5) >> 8);
          pcVar8 = (char *)(ulong)uVar7;
          *(char *)size = *(char *)size + cVar6;
          ram0x0013672d = 0x18000001;
          *pcVar8 = *pcVar8 + cVar6;
          *pcVar8 = *pcVar8 + (char)(&DAT_0012db5c + iVar5);
          *pcVar8 = *pcVar8 + cVar6;
          (&stack0xffffffffffffffe8)[(long)pcVar8] =
               (&stack0xffffffffffffffe8)[(long)pcVar8] + (char)whereami;
          pcVar8 = (char *)(**(code **)string)();
          *pcVar8 = *pcVar8 + (char)pcVar8;
          *pcVar8 = *pcVar8 + (char)pcVar8;
          halt_baddata();
        case 5:
          ram0x0013672d = 0x18000000;
          halt_baddata();
        case 7:
          in(0x5a);
          *(uint *)(string + -4) = *(uint *)(string + -4) ^ (uint)whereami;
          halt_baddata();
        }
        pbVar2 = (byte *)((long)statep + size * 2 + 0x75);
        *pbVar2 = *pbVar2 & (byte)((ulong)statep >> 8);
        puVar12 = (undefined4 *)(size + 1);
        uVar11 = SUB82(statep,0);
        out(*(undefined1 *)size,uVar11);
        uVar7 = *(uint *)((long)whereami + 0x74);
        pbVar2 = &UNK_0012dbc1 + in_FS_OFFSET + iVar5;
        bVar3 = *pbVar2;
        bVar4 = *pbVar2;
        *pbVar2 = *pbVar2 + bVar10;
        bVar17 = *pbVar2 == 0;
        bVar9 = (byte)((ulong)pcVar8 >> 8);
        if ((char)*pbVar2 < '\0') {
          out(*puVar12,uVar11);
          if (!CARRY1(bVar3,bVar10)) {
            *(byte *)statep = (byte)*statep & bVar9;
            *statep = *statep ^ uVar7;
            halt_baddata();
          }
          if (SCARRY1(bVar4,bVar10)) {
            halt_baddata();
          }
          if (!CARRY1(bVar3,bVar10)) {
            if (!bVar17) {
              halt_baddata();
            }
            halt_baddata();
          }
          if (bVar17) {
            halt_baddata();
          }
          if (!bVar17) {
            *pcVar8 = *pcVar8 + cVar6;
            *pcVar8 = *pcVar8 + cVar6;
            *pcVar8 = *pcVar8 + cVar6;
            halt_baddata();
          }
          puVar12 = (undefined4 *)(size + 6);
          out(*(undefined1 *)(size + 5),uVar11);
        }
        out(*(undefined1 *)puVar12,uVar11);
        *pcVar8 = *pcVar8 + cVar6;
        *pcVar8 = *pcVar8 + cVar6;
        *pcVar8 = *pcVar8 + cVar6;
        *(char *)((long)statep + 0x4b) = *(char *)((long)statep + 0x4b) + bVar9;
        halt_baddata();
      }
      uVar15 = uVar7 & 0x3c | uVar15;
      if (((uVar15 != 0x20) && (uVar15 != 0x21)) || (((ulong)pcVar8 & 8) == 0))
      goto switchD_0010bb9b_caseD_2c;
      pcVar8 = (char *)(ulong)((uint)pcVar8 & 0x1c0 | 2);
      uVar13 = uVar13 + 1;
      uVar14 = size;
      if (size == uVar13) goto switchD_0010bb9b_caseD_2c;
    } while( true );
  }
LAB_0010bc93:
  *statep = uVar7;
  *whereami = uVar14;
  return uVar7 >> 3 & 1;
switchD_0010bb9b_caseD_2c:
  uVar7 = (uint)pcVar8;
  goto LAB_0010bc93;
}

Assistant:

int /* PRIVATE */
png_check_fp_number(png_const_charp string, size_t size, int *statep,
    png_size_tp whereami)
{
   int state = *statep;
   size_t i = *whereami;

   while (i < size)
   {
      int type;
      /* First find the type of the next character */
      switch (string[i])
      {
      case 43:  type = PNG_FP_SAW_SIGN;                   break;
      case 45:  type = PNG_FP_SAW_SIGN + PNG_FP_NEGATIVE; break;
      case 46:  type = PNG_FP_SAW_DOT;                    break;
      case 48:  type = PNG_FP_SAW_DIGIT;                  break;
      case 49: case 50: case 51: case 52:
      case 53: case 54: case 55: case 56:
      case 57:  type = PNG_FP_SAW_DIGIT + PNG_FP_NONZERO; break;
      case 69:
      case 101: type = PNG_FP_SAW_E;                      break;
      default:  goto PNG_FP_End;
      }

      /* Now deal with this type according to the current
       * state, the type is arranged to not overlap the
       * bits of the PNG_FP_STATE.
       */
      switch ((state & PNG_FP_STATE) + (type & PNG_FP_SAW_ANY))
      {
      case PNG_FP_INTEGER + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, type);
         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DOT:
         /* Ok as trailer, ok as lead of fraction. */
         if ((state & PNG_FP_SAW_DOT) != 0) /* two dots */
            goto PNG_FP_End;

         else if ((state & PNG_FP_SAW_DIGIT) != 0) /* trailing dot? */
            png_fp_add(state, type);

         else
            png_fp_set(state, PNG_FP_FRACTION | type);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_DIGIT:
         if ((state & PNG_FP_SAW_DOT) != 0) /* delayed fraction */
            png_fp_set(state, PNG_FP_FRACTION | PNG_FP_SAW_DOT);

         png_fp_add(state, type | PNG_FP_WAS_VALID);

         break;

      case PNG_FP_INTEGER + PNG_FP_SAW_E:
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

   /* case PNG_FP_FRACTION + PNG_FP_SAW_SIGN:
         goto PNG_FP_End; ** no sign in fraction */

   /* case PNG_FP_FRACTION + PNG_FP_SAW_DOT:
         goto PNG_FP_End; ** Because SAW_DOT is always set */

      case PNG_FP_FRACTION + PNG_FP_SAW_DIGIT:
         png_fp_add(state, type | PNG_FP_WAS_VALID);
         break;

      case PNG_FP_FRACTION + PNG_FP_SAW_E:
         /* This is correct because the trailing '.' on an
          * integer is handled above - so we can only get here
          * with the sequence ".E" (with no preceding digits).
          */
         if ((state & PNG_FP_SAW_DIGIT) == 0)
            goto PNG_FP_End;

         png_fp_set(state, PNG_FP_EXPONENT);

         break;

      case PNG_FP_EXPONENT + PNG_FP_SAW_SIGN:
         if ((state & PNG_FP_SAW_ANY) != 0)
            goto PNG_FP_End; /* not a part of the number */

         png_fp_add(state, PNG_FP_SAW_SIGN);

         break;

   /* case PNG_FP_EXPONENT + PNG_FP_SAW_DOT:
         goto PNG_FP_End; */

      case PNG_FP_EXPONENT + PNG_FP_SAW_DIGIT:
         png_fp_add(state, PNG_FP_SAW_DIGIT | PNG_FP_WAS_VALID);

         break;

   /* case PNG_FP_EXPONEXT + PNG_FP_SAW_E:
         goto PNG_FP_End; */

      default: goto PNG_FP_End; /* I.e. break 2 */
      }

      /* The character seems ok, continue. */
      ++i;
   }

PNG_FP_End:
   /* Here at the end, update the state and return the correct
    * return code.
    */
   *statep = state;
   *whereami = i;

   return (state & PNG_FP_SAW_DIGIT) != 0;
}